

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

void Gia_Sim2InfoRefineEquivs(Gia_Sim2_t *p)

{
  int fCompl;
  int iVar1;
  Vec_Int_t *p_00;
  uint *p0;
  bool bVar2;
  int local_2c;
  int Count;
  int i;
  uint *pSim;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRefined;
  Gia_Sim2_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  local_2c = 1;
  while( true ) {
    bVar2 = false;
    if (local_2c < p->pAig->nObjs) {
      pSim = (uint *)Gia_ManObj(p->pAig,local_2c);
      bVar2 = (Gia_Obj_t *)pSim != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsConst(p->pAig,local_2c);
    if (iVar1 != 0) {
      p0 = Gia_Sim2Data(p,local_2c);
      iVar1 = p->nWords;
      fCompl = Gia_ObjPhase((Gia_Obj_t *)pSim);
      iVar1 = Gia_Sim2CompareZero(p0,iVar1,fCompl);
      if (iVar1 == 0) {
        Vec_IntPush(p_00,local_2c);
      }
    }
    local_2c = local_2c + 1;
  }
  Gia_Sim2ProcessRefined(p,p_00);
  Vec_IntFree(p_00);
  for (local_2c = 1; iVar1 = Gia_ManObjNum(p->pAig), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Gia_ObjIsHead(p->pAig,local_2c);
    if (iVar1 != 0) {
      Gia_Sim2ClassRefineOne(p,local_2c);
    }
  }
  return;
}

Assistant:

void Gia_Sim2InfoRefineEquivs( Gia_Sim2_t * p )
{
    Vec_Int_t * vRefined;
    Gia_Obj_t * pObj;
    unsigned * pSim;
    int i, Count = 0;
    // process constant candidates
    vRefined = Vec_IntAlloc( 100 );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( !Gia_ObjIsConst(p->pAig, i) )
            continue;
        pSim = Gia_Sim2Data( p, i );
//Extra_PrintBinary( stdout, pSim, 32 * p->nWords );  printf( "\n" );
        if ( !Gia_Sim2CompareZero( pSim, p->nWords, Gia_ObjPhase(pObj) ) )
        {
            Vec_IntPush( vRefined, i );
            Count++;
        }
    }
    Gia_Sim2ProcessRefined( p, vRefined );
    Vec_IntFree( vRefined );
    // process other classes
    Gia_ManForEachClass( p->pAig, i )
        Count += Gia_Sim2ClassRefineOne( p, i );
//    if ( Count )
//        printf( "Refined %d times.\n", Count );
}